

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::SingleBufferCopyCase::iterate(SingleBufferCopyCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 buffer;
  GLenum GVar4;
  ulong uVar5;
  uint uVar6;
  char *description;
  int *piVar7;
  BufferVerifier verifier;
  ReferenceBuffer ref;
  BufferVerifier local_68;
  deUint32 local_5c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ulong local_38;
  
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_68,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             this->m_verifyType);
  local_58._M_impl.super__Vector_impl_data._M_start = (deUint8 *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                          _M_p);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)&local_58,1000);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_srcTarget,buffer);
  uVar6 = 1;
  piVar7 = &iterate::copyRanges[0].copySize;
  uVar5 = 0;
  while (((uVar6 & 1) != 0 && (uVar5 < 4))) {
    iVar1 = ((anon_struct_12_3_32f5df47 *)(piVar7 + -2))->srcOffset;
    iVar2 = piVar7[-1];
    iVar3 = *piVar7;
    uVar6 = ((uint)uVar5 ^ 0x3d) * 9;
    uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
    local_38 = uVar5;
    deqp::gls::BufferTestUtil::fillWithRandomBytes
              (local_58._M_impl.super__Vector_impl_data._M_start,1000,
               uVar6 >> 0xf ^ local_5c ^ uVar6);
    glu::CallLogWrapper::glBindBuffer(this_00,this->m_srcTarget,buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,this->m_srcTarget,1000,local_58._M_impl.super__Vector_impl_data._M_start,
               this->m_hint);
    GVar4 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar4,"glBufferData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                    ,0xcc);
    memcpy(local_58._M_impl.super__Vector_impl_data._M_start + iVar2,
           local_58._M_impl.super__Vector_impl_data._M_start + iVar1,(long)iVar3);
    glu::CallLogWrapper::glBindBuffer(this_00,this->m_dstTarget,buffer);
    glu::CallLogWrapper::glCopyBufferSubData
              (this_00,this->m_srcTarget,this->m_dstTarget,(long)iVar1,(long)iVar2,(long)iVar3);
    GVar4 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar4,"glCopyBufferSubData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                    ,0xd3);
    uVar6 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                      (&local_68,(EVP_PKEY_CTX *)(ulong)buffer,
                       local_58._M_impl.super__Vector_impl_data._M_start,0,(uchar *)0x3e8,
                       (ulong)this->m_dstTarget);
    piVar7 = piVar7 + 3;
    uVar5 = local_38 + 1;
  }
  description = "Buffer verification failed";
  if ((uVar6 & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(byte)uVar6 & QP_TEST_RESULT_FAIL,description);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_68);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int		size		= 1000;
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verifyType);
		ReferenceBuffer	ref;
		deUint32		buf			= 0;
		deUint32		baseSeed	= deStringHash(getName());
		bool			isOk		= true;

		ref.setSize(size);

		// Create buffer.
		buf = genBuffer();
		glBindBuffer(m_srcTarget, buf);

		static const struct
		{
			int				srcOffset;
			int				dstOffset;
			int				copySize;
		} copyRanges[] =
		{
			{ 57,		701,	101 },	// Non-adjecent, from low to high.
			{ 640,		101,	101 },	// Non-adjecent, from high to low.
			{ 0,		500,	500 },	// Lower half to upper half.
			{ 500,		0,		500 }	// Upper half to lower half.
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(copyRanges) && isOk; ndx++)
		{
			int	srcOffset	= copyRanges[ndx].srcOffset;
			int	dstOffset	= copyRanges[ndx].dstOffset;
			int	copySize	= copyRanges[ndx].copySize;

			fillWithRandomBytes(ref.getPtr(), size, baseSeed ^ deInt32Hash(ndx));

			// Fill with data.
			glBindBuffer(m_srcTarget, buf);
			glBufferData(m_srcTarget, size, ref.getPtr(), m_hint);
			GLU_CHECK_MSG("glBufferData");

			// Execute copy.
			deMemcpy(ref.getPtr()+dstOffset, ref.getPtr()+srcOffset, copySize);

			glBindBuffer(m_dstTarget, buf);
			glCopyBufferSubData(m_srcTarget, m_dstTarget, srcOffset, dstOffset, copySize);
			GLU_CHECK_MSG("glCopyBufferSubData");

			// Verify buffer after copy.
			isOk = verifier.verify(buf, ref.getPtr(), 0, size, m_dstTarget) && isOk;
		}

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}